

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2010.h
# Opt level: O0

void __thiscall
BBDT<RemSP>::PerformLabelingMem
          (BBDT<RemSP> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int iVar1;
  int iVar2;
  Mat1b *pMVar3;
  uint uVar4;
  uchar *puVar5;
  int *piVar6;
  uint *puVar7;
  reference pvVar8;
  double dVar9;
  Mat_<int> local_2c8;
  allocator<unsigned_long> local_261;
  value_type_conflict2 local_260;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_258;
  uint local_23c;
  int local_238;
  int iLabel;
  int c_1;
  int r_1;
  int c;
  int r;
  undefined1 local_220 [8];
  MemMat<int> img_labels;
  Mat_<unsigned_char> local_148;
  undefined1 local_e8 [8];
  MemMat<unsigned_char> img;
  int w;
  int h;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses_local;
  BBDT<RemSP> *this_local;
  
  img.accesses_._92_4_ =
       *(undefined4 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  img.accesses_._88_4_ =
       *(undefined4 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar1 = *(int *)&pMVar3->field_0x8;
  iVar2 = *(int *)&pMVar3->field_0xc;
  RemSP::MemAlloc(((iVar1 + 1) - (iVar1 + 1 >> 0x1f) >> 1) *
                  ((iVar2 + 1) - (iVar2 + 1 >> 0x1f) >> 1) + 1);
  RemSP::MemSetup();
  cv::Mat_<unsigned_char>::Mat_(&local_148,(this->super_Labeling2D<(Connectivity2D)8,_false>).img_);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_e8,&local_148);
  cv::Mat_<unsigned_char>::~Mat_(&local_148);
  cv::MatSize::operator()((MatSize *)&c);
  MemMat<int>::MemMat((MemMat<int> *)local_220,(Size *)&c,0);
  for (r_1 = 0; r_1 < (int)img.accesses_._92_4_; r_1 = r_1 + 2) {
    for (c_1 = 0; c_1 < (int)img.accesses_._88_4_; c_1 = c_1 + 2) {
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e8,r_1,c_1);
      if (*puVar5 == '\0') {
        if ((r_1 + 1 < (int)img.accesses_._92_4_) &&
           (puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_1 + 1,c_1), *puVar5 != '\0')) {
          if ((c_1 + 1 < (int)img.accesses_._88_4_) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + 1), *puVar5 != '\0'))
          {
            if ((c_1 + -1 < 0) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + -1), *puVar5 == '\0'
               )) {
              if (((c_1 + -1 < 0) || ((int)img.accesses_._92_4_ <= r_1 + 1)) ||
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_1 + 1,c_1 + -1),
                 *puVar5 == '\0')) {
                if (((c_1 + 1 < (int)img.accesses_._88_4_) && (-1 < r_1 + -1)) &&
                   (puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + 1),
                   *puVar5 != '\0')) {
                  piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                  iVar1 = *piVar6;
                  piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *piVar6 = iVar1;
                }
                else if (((c_1 + 2 < (int)img.accesses_._88_4_) && (-1 < r_1 + -1)) &&
                        (puVar5 = MemMat<unsigned_char>::operator()
                                            ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + 2),
                        *puVar5 != '\0')) {
                  if ((r_1 + -1 < 0) ||
                     (puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1),
                     *puVar5 == '\0')) {
                    piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                    iVar1 = *piVar6;
                    piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *piVar6 = iVar1;
                  }
                  else if ((c_1 + 1 < (int)img.accesses_._88_4_) &&
                          ((-1 < r_1 + -2 &&
                           (puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + 1),
                           *puVar5 != '\0')))) {
                    piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                    iVar1 = *piVar6;
                    piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *piVar6 = iVar1;
                  }
                  else {
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                    uVar4 = *puVar7;
                    puVar7 = (uint *)MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                    uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *puVar7 = uVar4;
                  }
                }
                else if ((r_1 + -1 < 0) ||
                        (puVar5 = MemMat<unsigned_char>::operator()
                                            ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1),
                        *puVar5 == '\0')) {
                  uVar4 = RemSP::MemNewLabel();
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *puVar7 = uVar4;
                }
                else {
                  piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                  iVar1 = *piVar6;
                  piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *piVar6 = iVar1;
                }
              }
              else if (((c_1 + 1 < (int)img.accesses_._88_4_) && (-1 < r_1 + -1)) &&
                      (puVar5 = MemMat<unsigned_char>::operator()
                                          ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + 1),
                      *puVar5 != '\0')) {
                if ((c_1 + -2 < 0) ||
                   (puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + -2),
                   *puVar5 == '\0')) {
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                  uVar4 = *puVar7;
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *puVar7 = uVar4;
                }
                else if ((c_1 + -1 < 0) ||
                        ((r_1 + -1 < 0 ||
                         (puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -1),
                         *puVar5 == '\0')))) {
                  if (((c_1 + -2 < 0) || (r_1 + -1 < 0)) ||
                     (puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -2),
                     *puVar5 == '\0')) {
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                    uVar4 = *puVar7;
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                    uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *puVar7 = uVar4;
                  }
                  else if (((c_1 + -1 < 0) || (r_1 + -2 < 0)) ||
                          (puVar5 = MemMat<unsigned_char>::operator()
                                              ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + -1),
                          *puVar5 == '\0')) {
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                    uVar4 = *puVar7;
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                    uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *puVar7 = uVar4;
                  }
                  else if ((r_1 + -1 < 0) ||
                          (puVar5 = MemMat<unsigned_char>::operator()
                                              ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1),
                          *puVar5 == '\0')) {
                    if ((r_1 + -2 < 0) ||
                       (puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1),
                       *puVar5 == '\0')) {
                      puVar7 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_1 + -2,c_1);
                      uVar4 = *puVar7;
                      puVar7 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_1,c_1 + -2);
                      uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                      puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                      *puVar7 = uVar4;
                    }
                    else {
                      piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                      iVar1 = *piVar6;
                      piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                      *piVar6 = iVar1;
                    }
                  }
                  else {
                    piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                    iVar1 = *piVar6;
                    piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *piVar6 = iVar1;
                  }
                }
                else if ((r_1 + -1 < 0) ||
                        (puVar5 = MemMat<unsigned_char>::operator()
                                            ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1),
                        *puVar5 == '\0')) {
                  if ((r_1 + -2 < 0) ||
                     (puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1),
                     *puVar5 == '\0')) {
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                    uVar4 = *puVar7;
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                    uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *puVar7 = uVar4;
                  }
                  else {
                    piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                    iVar1 = *piVar6;
                    piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *piVar6 = iVar1;
                  }
                }
                else {
                  piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  iVar1 = *piVar6;
                  piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *piVar6 = iVar1;
                }
              }
              else if (((c_1 + 2 < (int)img.accesses_._88_4_) && (-1 < r_1 + -1)) &&
                      (puVar5 = MemMat<unsigned_char>::operator()
                                          ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + 2),
                      *puVar5 != '\0')) {
                if (((c_1 + 1 < (int)img.accesses_._88_4_) && (-1 < r_1 + -2)) &&
                   (puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + 1),
                   *puVar5 != '\0')) {
                  if ((c_1 + -2 < 0) ||
                     (puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + -2),
                     *puVar5 == '\0')) {
                    puVar7 = (uint *)MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                    uVar4 = *puVar7;
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                    uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *puVar7 = uVar4;
                  }
                  else if ((c_1 + -1 < 0) ||
                          ((r_1 + -1 < 0 ||
                           (puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -1)
                           , *puVar5 == '\0')))) {
                    if (((c_1 + -2 < 0) || (r_1 + -1 < 0)) ||
                       (puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -2),
                       *puVar5 == '\0')) {
                      puVar7 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                      uVar4 = *puVar7;
                      puVar7 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_1,c_1 + -2);
                      uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                      puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                      *puVar7 = uVar4;
                    }
                    else if (((c_1 + -1 < 0) || (r_1 + -2 < 0)) ||
                            (puVar5 = MemMat<unsigned_char>::operator()
                                                ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + -1
                                                ), *puVar5 == '\0')) {
                      puVar7 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                      uVar4 = *puVar7;
                      puVar7 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_1,c_1 + -2);
                      uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                      puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                      *puVar7 = uVar4;
                    }
                    else if ((r_1 + -1 < 0) ||
                            (puVar5 = MemMat<unsigned_char>::operator()
                                                ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1),
                            *puVar5 == '\0')) {
                      if ((r_1 + -2 < 0) ||
                         (puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1),
                         *puVar5 == '\0')) {
                        puVar7 = (uint *)MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                        uVar4 = *puVar7;
                        puVar7 = (uint *)MemMat<int>::operator()
                                                   ((MemMat<int> *)local_220,r_1,c_1 + -2);
                        uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                        puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                        *puVar7 = uVar4;
                      }
                      else {
                        piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                        iVar1 = *piVar6;
                        piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                        *piVar6 = iVar1;
                      }
                    }
                    else {
                      piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                      iVar1 = *piVar6;
                      piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                      *piVar6 = iVar1;
                    }
                  }
                  else if ((r_1 + -1 < 0) ||
                          (puVar5 = MemMat<unsigned_char>::operator()
                                              ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1),
                          *puVar5 == '\0')) {
                    if ((r_1 + -2 < 0) ||
                       (puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1),
                       *puVar5 == '\0')) {
                      puVar7 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                      uVar4 = *puVar7;
                      puVar7 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_1,c_1 + -2);
                      uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                      puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                      *puVar7 = uVar4;
                    }
                    else {
                      piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                      iVar1 = *piVar6;
                      piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                      *piVar6 = iVar1;
                    }
                  }
                  else {
                    piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                    iVar1 = *piVar6;
                    piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *piVar6 = iVar1;
                  }
                }
                else if ((r_1 + -1 < 0) ||
                        (puVar5 = MemMat<unsigned_char>::operator()
                                            ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1),
                        *puVar5 == '\0')) {
                  puVar7 = (uint *)MemMat<int>::operator()
                                             ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                  uVar4 = *puVar7;
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *puVar7 = uVar4;
                }
                else if ((c_1 + -2 < 0) ||
                        (puVar5 = MemMat<unsigned_char>::operator()
                                            ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + -2),
                        *puVar5 == '\0')) {
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                  uVar4 = *puVar7;
                  puVar7 = (uint *)MemMat<int>::operator()
                                             ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                  uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *puVar7 = uVar4;
                }
                else if (((c_1 + -1 < 0) || (r_1 + -1 < 0)) ||
                        (puVar5 = MemMat<unsigned_char>::operator()
                                            ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -1),
                        *puVar5 == '\0')) {
                  if (((c_1 + -2 < 0) || (r_1 + -1 < 0)) ||
                     (puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -2),
                     *puVar5 == '\0')) {
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                    uVar4 = *puVar7;
                    puVar7 = (uint *)MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                    uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                    uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *puVar7 = uVar4;
                  }
                  else if (((c_1 + -1 < 0) || (r_1 + -2 < 0)) ||
                          (puVar5 = MemMat<unsigned_char>::operator()
                                              ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + -1),
                          *puVar5 == '\0')) {
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                    uVar4 = *puVar7;
                    puVar7 = (uint *)MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                    uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                    uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *puVar7 = uVar4;
                  }
                  else {
                    puVar7 = (uint *)MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                    uVar4 = *puVar7;
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                    uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *puVar7 = uVar4;
                  }
                }
                else {
                  puVar7 = (uint *)MemMat<int>::operator()
                                             ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                  uVar4 = *puVar7;
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *puVar7 = uVar4;
                }
              }
              else if ((r_1 + -1 < 0) ||
                      (puVar5 = MemMat<unsigned_char>::operator()
                                          ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1),
                      *puVar5 == '\0')) {
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                iVar1 = *piVar6;
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *piVar6 = iVar1;
              }
              else if ((c_1 + -2 < 0) ||
                      (puVar5 = MemMat<unsigned_char>::operator()
                                          ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + -2),
                      *puVar5 == '\0')) {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *puVar7 = uVar4;
              }
              else if (((c_1 + -1 < 0) || (r_1 + -1 < 0)) ||
                      (puVar5 = MemMat<unsigned_char>::operator()
                                          ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -1),
                      *puVar5 == '\0')) {
                if (((c_1 + -2 < 0) || (r_1 + -1 < 0)) ||
                   (puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -2),
                   *puVar5 == '\0')) {
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                  uVar4 = *puVar7;
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *puVar7 = uVar4;
                }
                else if (((c_1 + -1 < 0) || (r_1 + -2 < 0)) ||
                        (puVar5 = MemMat<unsigned_char>::operator()
                                            ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + -1),
                        *puVar5 == '\0')) {
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                  uVar4 = *puVar7;
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *puVar7 = uVar4;
                }
                else {
                  piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  iVar1 = *piVar6;
                  piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *piVar6 = iVar1;
                }
              }
              else {
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                iVar1 = *piVar6;
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *piVar6 = iVar1;
              }
            }
            else if ((c_1 + 1 < (int)img.accesses_._88_4_) &&
                    ((-1 < r_1 + -1 &&
                     (puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + 1),
                     *puVar5 != '\0')))) {
              if ((r_1 + -1 < 0) ||
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1),
                 *puVar5 == '\0')) {
                if ((r_1 + -2 < 0) ||
                   (puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1),
                   *puVar5 == '\0')) {
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                  uVar4 = *puVar7;
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *puVar7 = uVar4;
                }
                else if ((c_1 + -1 < 0) ||
                        ((r_1 + -1 < 0 ||
                         (puVar5 = MemMat<unsigned_char>::operator()
                                             ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -1),
                         *puVar5 == '\0')))) {
                  if (((c_1 + -2 < 0) || (r_1 + -1 < 0)) ||
                     (puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -2),
                     *puVar5 == '\0')) {
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                    uVar4 = *puVar7;
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                    uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *puVar7 = uVar4;
                  }
                  else if (((c_1 + -1 < 0) || (r_1 + -2 < 0)) ||
                          (puVar5 = MemMat<unsigned_char>::operator()
                                              ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + -1),
                          *puVar5 == '\0')) {
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                    uVar4 = *puVar7;
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                    uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *puVar7 = uVar4;
                  }
                  else {
                    piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                    iVar1 = *piVar6;
                    piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *piVar6 = iVar1;
                  }
                }
                else {
                  piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  iVar1 = *piVar6;
                  piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *piVar6 = iVar1;
                }
              }
              else {
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                iVar1 = *piVar6;
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *piVar6 = iVar1;
              }
            }
            else if (((c_1 + 2 < (int)img.accesses_._88_4_) && (-1 < r_1 + -1)) &&
                    (puVar5 = MemMat<unsigned_char>::operator()
                                        ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + 2),
                    *puVar5 != '\0')) {
              if (((c_1 + 1 < (int)img.accesses_._88_4_) && (-1 < r_1 + -2)) &&
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + 1),
                 *puVar5 != '\0')) {
                if ((r_1 + -1 < 0) ||
                   (puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1),
                   *puVar5 == '\0')) {
                  if ((r_1 + -2 < 0) ||
                     (puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1),
                     *puVar5 == '\0')) {
                    puVar7 = (uint *)MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                    uVar4 = *puVar7;
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                    uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *puVar7 = uVar4;
                  }
                  else if ((c_1 + -1 < 0) ||
                          ((r_1 + -1 < 0 ||
                           (puVar5 = MemMat<unsigned_char>::operator()
                                               ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -1)
                           , *puVar5 == '\0')))) {
                    if (((c_1 + -2 < 0) || (r_1 + -1 < 0)) ||
                       (puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -2),
                       *puVar5 == '\0')) {
                      puVar7 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                      uVar4 = *puVar7;
                      puVar7 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_1,c_1 + -2);
                      uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                      puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                      *puVar7 = uVar4;
                    }
                    else if (((c_1 + -1 < 0) || (r_1 + -2 < 0)) ||
                            (puVar5 = MemMat<unsigned_char>::operator()
                                                ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + -1
                                                ), *puVar5 == '\0')) {
                      puVar7 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                      uVar4 = *puVar7;
                      puVar7 = (uint *)MemMat<int>::operator()
                                                 ((MemMat<int> *)local_220,r_1,c_1 + -2);
                      uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                      puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                      *puVar7 = uVar4;
                    }
                    else {
                      piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                      iVar1 = *piVar6;
                      piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                      *piVar6 = iVar1;
                    }
                  }
                  else {
                    piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                    iVar1 = *piVar6;
                    piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *piVar6 = iVar1;
                  }
                }
                else {
                  piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  iVar1 = *piVar6;
                  piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *piVar6 = iVar1;
                }
              }
              else {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *puVar7 = uVar4;
              }
            }
            else {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *piVar6 = iVar1;
            }
          }
          else if (((c_1 + -1 < 0) || ((int)img.accesses_._92_4_ <= r_1 + 1)) ||
                  (puVar5 = MemMat<unsigned_char>::operator()
                                      ((MemMat<unsigned_char> *)local_e8,r_1 + 1,c_1 + -1),
                  *puVar5 == '\0')) {
            if ((c_1 + -1 < 0) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + -1), *puVar5 == '\0'
               )) {
              uVar4 = RemSP::MemNewLabel();
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *puVar7 = uVar4;
            }
            else {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *piVar6 = iVar1;
            }
          }
          else {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
            *piVar6 = iVar1;
          }
        }
        else if ((c_1 + 1 < (int)img.accesses_._88_4_) &&
                (puVar5 = MemMat<unsigned_char>::operator()
                                    ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + 1), *puVar5 != '\0'
                )) {
          if ((c_1 + 1 < (int)img.accesses_._88_4_) &&
             ((-1 < r_1 + -1 &&
              (puVar5 = MemMat<unsigned_char>::operator()
                                  ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + 1),
              *puVar5 != '\0')))) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
            *piVar6 = iVar1;
          }
          else if (((c_1 + 2 < (int)img.accesses_._88_4_) && (-1 < r_1 + -1)) &&
                  (puVar5 = MemMat<unsigned_char>::operator()
                                      ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + 2),
                  *puVar5 != '\0')) {
            if ((r_1 + -1 < 0) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1), *puVar5 == '\0'
               )) {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *piVar6 = iVar1;
            }
            else if ((c_1 + 1 < (int)img.accesses_._88_4_) &&
                    ((-1 < r_1 + -2 &&
                     (puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + 1),
                     *puVar5 != '\0')))) {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *piVar6 = iVar1;
            }
            else {
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
              uVar4 = *puVar7;
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
              uVar4 = RemSP::MemMerge(uVar4,*puVar7);
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *puVar7 = uVar4;
            }
          }
          else if ((r_1 + -1 < 0) ||
                  (puVar5 = MemMat<unsigned_char>::operator()
                                      ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1),
                  *puVar5 == '\0')) {
            uVar4 = RemSP::MemNewLabel();
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
            *puVar7 = uVar4;
          }
          else {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
            *piVar6 = iVar1;
          }
        }
        else if (((c_1 + 1 < (int)img.accesses_._88_4_) && (r_1 + 1 < (int)img.accesses_._92_4_)) &&
                (puVar5 = MemMat<unsigned_char>::operator()
                                    ((MemMat<unsigned_char> *)local_e8,r_1 + 1,c_1 + 1),
                *puVar5 != '\0')) {
          uVar4 = RemSP::MemNewLabel();
          puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
          *puVar7 = uVar4;
        }
        else {
          piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
          *piVar6 = 0;
        }
      }
      else if ((c_1 + -1 < 0) ||
              (puVar5 = MemMat<unsigned_char>::operator()
                                  ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + -1), *puVar5 == '\0')
              ) {
        if (((c_1 + -1 < 0) || ((int)img.accesses_._92_4_ <= r_1 + 1)) ||
           (puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_1 + 1,c_1 + -1), *puVar5 == '\0'
           )) {
          if (((c_1 + 1 < (int)img.accesses_._88_4_) && (-1 < r_1 + -1)) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + 1),
             *puVar5 != '\0')) {
            if ((r_1 + -1 < 0) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1), *puVar5 == '\0'
               )) {
              if (((c_1 + -1 < 0) || (r_1 + -1 < 0)) ||
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -1),
                 *puVar5 == '\0')) {
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                iVar1 = *piVar6;
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *piVar6 = iVar1;
              }
              else if ((r_1 + -2 < 0) ||
                      (puVar5 = MemMat<unsigned_char>::operator()
                                          ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1),
                      *puVar5 == '\0')) {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + -2)
                ;
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *puVar7 = uVar4;
              }
              else {
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                iVar1 = *piVar6;
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *piVar6 = iVar1;
              }
            }
            else {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *piVar6 = iVar1;
            }
          }
          else if ((c_1 + 1 < (int)img.accesses_._88_4_) &&
                  (puVar5 = MemMat<unsigned_char>::operator()
                                      ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + 1),
                  *puVar5 != '\0')) {
            if ((c_1 + 2 < (int)img.accesses_._88_4_) &&
               ((-1 < r_1 + -1 &&
                (puVar5 = MemMat<unsigned_char>::operator()
                                    ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + 2),
                *puVar5 != '\0')))) {
              if ((r_1 + -1 < 0) ||
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1),
                 *puVar5 == '\0')) {
                if (((c_1 + -1 < 0) || (r_1 + -1 < 0)) ||
                   (puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -1),
                   *puVar5 == '\0')) {
                  piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                  iVar1 = *piVar6;
                  piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *piVar6 = iVar1;
                }
                else if (((c_1 + 1 < (int)img.accesses_._88_4_) && (-1 < r_1 + -2)) &&
                        (puVar5 = MemMat<unsigned_char>::operator()
                                            ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + 1),
                        *puVar5 != '\0')) {
                  if ((r_1 + -2 < 0) ||
                     (puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1),
                     *puVar5 == '\0')) {
                    puVar7 = (uint *)MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_1 + -2,c_1 + -2);
                    uVar4 = *puVar7;
                    puVar7 = (uint *)MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                    uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *puVar7 = uVar4;
                  }
                  else {
                    piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                    iVar1 = *piVar6;
                    piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *piVar6 = iVar1;
                  }
                }
                else {
                  puVar7 = (uint *)MemMat<int>::operator()
                                             ((MemMat<int> *)local_220,r_1 + -2,c_1 + -2);
                  uVar4 = *puVar7;
                  puVar7 = (uint *)MemMat<int>::operator()
                                             ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                  uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *puVar7 = uVar4;
                }
              }
              else if (((c_1 + 1 < (int)img.accesses_._88_4_) && (-1 < r_1 + -2)) &&
                      (puVar5 = MemMat<unsigned_char>::operator()
                                          ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + 1),
                      *puVar5 != '\0')) {
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                iVar1 = *piVar6;
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *piVar6 = iVar1;
              }
              else {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *puVar7 = uVar4;
              }
            }
            else if ((r_1 + -1 < 0) ||
                    (puVar5 = MemMat<unsigned_char>::operator()
                                        ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1),
                    *puVar5 == '\0')) {
              if (((c_1 + -1 < 0) || (r_1 + -1 < 0)) ||
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -1),
                 *puVar5 == '\0')) {
                uVar4 = RemSP::MemNewLabel();
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *puVar7 = uVar4;
              }
              else {
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + -2);
                iVar1 = *piVar6;
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *piVar6 = iVar1;
              }
            }
            else {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *piVar6 = iVar1;
            }
          }
          else if ((r_1 + -1 < 0) ||
                  (puVar5 = MemMat<unsigned_char>::operator()
                                      ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1),
                  *puVar5 == '\0')) {
            if (((c_1 + -1 < 0) || (r_1 + -1 < 0)) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -1),
               *puVar5 == '\0')) {
              uVar4 = RemSP::MemNewLabel();
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *puVar7 = uVar4;
            }
            else {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + -2);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *piVar6 = iVar1;
            }
          }
          else {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
            *piVar6 = iVar1;
          }
        }
        else if (((c_1 + 1 < (int)img.accesses_._88_4_) && (-1 < r_1 + -1)) &&
                (puVar5 = MemMat<unsigned_char>::operator()
                                    ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + 1),
                *puVar5 != '\0')) {
          if ((c_1 + -2 < 0) ||
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + -2), *puVar5 == '\0'))
          {
            if ((r_1 + -1 < 0) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1), *puVar5 == '\0'
               )) {
              if (((c_1 + -1 < 0) || (r_1 + -1 < 0)) ||
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -1),
                 *puVar5 == '\0')) {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *puVar7 = uVar4;
              }
              else if ((r_1 + -2 < 0) ||
                      (puVar5 = MemMat<unsigned_char>::operator()
                                          ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1),
                      *puVar5 == '\0')) {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + -2)
                ;
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *puVar7 = uVar4;
              }
              else {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *puVar7 = uVar4;
              }
            }
            else {
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
              uVar4 = *puVar7;
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
              uVar4 = RemSP::MemMerge(uVar4,*puVar7);
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *puVar7 = uVar4;
            }
          }
          else if ((c_1 + -1 < 0) ||
                  ((r_1 + -1 < 0 ||
                   (puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -1),
                   *puVar5 == '\0')))) {
            if (((c_1 + -2 < 0) || (r_1 + -1 < 0)) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -2),
               *puVar5 == '\0')) {
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
              uVar4 = *puVar7;
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
              uVar4 = RemSP::MemMerge(uVar4,*puVar7);
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *puVar7 = uVar4;
            }
            else if (((c_1 + -1 < 0) || (r_1 + -2 < 0)) ||
                    (puVar5 = MemMat<unsigned_char>::operator()
                                        ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + -1),
                    *puVar5 == '\0')) {
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
              uVar4 = *puVar7;
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
              uVar4 = RemSP::MemMerge(uVar4,*puVar7);
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *puVar7 = uVar4;
            }
            else if ((r_1 + -1 < 0) ||
                    (puVar5 = MemMat<unsigned_char>::operator()
                                        ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1),
                    *puVar5 == '\0')) {
              if ((r_1 + -2 < 0) ||
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1),
                 *puVar5 == '\0')) {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *puVar7 = uVar4;
              }
              else {
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                iVar1 = *piVar6;
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *piVar6 = iVar1;
              }
            }
            else {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *piVar6 = iVar1;
            }
          }
          else if ((r_1 + -1 < 0) ||
                  (puVar5 = MemMat<unsigned_char>::operator()
                                      ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1),
                  *puVar5 == '\0')) {
            if ((r_1 + -2 < 0) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1), *puVar5 == '\0'
               )) {
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
              uVar4 = *puVar7;
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
              uVar4 = RemSP::MemMerge(uVar4,*puVar7);
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *puVar7 = uVar4;
            }
            else {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *piVar6 = iVar1;
            }
          }
          else {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
            *piVar6 = iVar1;
          }
        }
        else if ((c_1 + 1 < (int)img.accesses_._88_4_) &&
                (puVar5 = MemMat<unsigned_char>::operator()
                                    ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + 1), *puVar5 != '\0'
                )) {
          if ((c_1 + 2 < (int)img.accesses_._88_4_) &&
             ((-1 < r_1 + -1 &&
              (puVar5 = MemMat<unsigned_char>::operator()
                                  ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + 2),
              *puVar5 != '\0')))) {
            if ((c_1 + -2 < 0) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + -2), *puVar5 == '\0'
               )) {
              if ((r_1 + -1 < 0) ||
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1),
                 *puVar5 == '\0')) {
                if (((c_1 + -1 < 0) || (r_1 + -1 < 0)) ||
                   (puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -1),
                   *puVar5 == '\0')) {
                  puVar7 = (uint *)MemMat<int>::operator()
                                             ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                  uVar4 = *puVar7;
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *puVar7 = uVar4;
                }
                else if (((c_1 + 1 < (int)img.accesses_._88_4_) && (-1 < r_1 + -2)) &&
                        (puVar5 = MemMat<unsigned_char>::operator()
                                            ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + 1),
                        *puVar5 != '\0')) {
                  if ((r_1 + -2 < 0) ||
                     (puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1),
                     *puVar5 == '\0')) {
                    puVar7 = (uint *)MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_1 + -2,c_1 + -2);
                    uVar4 = *puVar7;
                    puVar7 = (uint *)MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                    uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                    uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *puVar7 = uVar4;
                  }
                  else {
                    puVar7 = (uint *)MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                    uVar4 = *puVar7;
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                    uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *puVar7 = uVar4;
                  }
                }
                else {
                  puVar7 = (uint *)MemMat<int>::operator()
                                             ((MemMat<int> *)local_220,r_1 + -2,c_1 + -2);
                  uVar4 = *puVar7;
                  puVar7 = (uint *)MemMat<int>::operator()
                                             ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                  uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *puVar7 = uVar4;
                }
              }
              else if ((c_1 + 1 < (int)img.accesses_._88_4_) &&
                      ((-1 < r_1 + -2 &&
                       (puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + 1),
                       *puVar5 != '\0')))) {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *puVar7 = uVar4;
              }
              else {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *puVar7 = uVar4;
              }
            }
            else if (((c_1 + -1 < 0) || (r_1 + -1 < 0)) ||
                    (puVar5 = MemMat<unsigned_char>::operator()
                                        ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -1),
                    *puVar5 == '\0')) {
              if (((c_1 + 1 < (int)img.accesses_._88_4_) && (-1 < r_1 + -2)) &&
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + 1),
                 *puVar5 != '\0')) {
                if (((c_1 + -2 < 0) || (r_1 + -1 < 0)) ||
                   (puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -2),
                   *puVar5 == '\0')) {
                  puVar7 = (uint *)MemMat<int>::operator()
                                             ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                  uVar4 = *puVar7;
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *puVar7 = uVar4;
                }
                else if (((c_1 + -1 < 0) || (r_1 + -2 < 0)) ||
                        (puVar5 = MemMat<unsigned_char>::operator()
                                            ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + -1),
                        *puVar5 == '\0')) {
                  puVar7 = (uint *)MemMat<int>::operator()
                                             ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                  uVar4 = *puVar7;
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *puVar7 = uVar4;
                }
                else if ((r_1 + -1 < 0) ||
                        (puVar5 = MemMat<unsigned_char>::operator()
                                            ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1),
                        *puVar5 == '\0')) {
                  if ((r_1 + -2 < 0) ||
                     (puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1),
                     *puVar5 == '\0')) {
                    puVar7 = (uint *)MemMat<int>::operator()
                                               ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                    uVar4 = *puVar7;
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                    uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *puVar7 = uVar4;
                  }
                  else {
                    piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                    iVar1 = *piVar6;
                    piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                    *piVar6 = iVar1;
                  }
                }
                else {
                  piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  iVar1 = *piVar6;
                  piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *piVar6 = iVar1;
                }
              }
              else if ((r_1 + -1 < 0) ||
                      (puVar5 = MemMat<unsigned_char>::operator()
                                          ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1),
                      *puVar5 == '\0')) {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *puVar7 = uVar4;
              }
              else if ((c_1 + -2 < 0) ||
                      ((r_1 + -1 < 0 ||
                       (puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -2),
                       *puVar5 == '\0')))) {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *puVar7 = uVar4;
              }
              else if ((c_1 + -1 < 0) ||
                      ((r_1 + -2 < 0 ||
                       (puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + -1),
                       *puVar5 == '\0')))) {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *puVar7 = uVar4;
              }
              else {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *puVar7 = uVar4;
              }
            }
            else if (((c_1 + 1 < (int)img.accesses_._88_4_) && (-1 < r_1 + -2)) &&
                    (puVar5 = MemMat<unsigned_char>::operator()
                                        ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + 1),
                    *puVar5 != '\0')) {
              if ((r_1 + -1 < 0) ||
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1),
                 *puVar5 == '\0')) {
                if ((r_1 + -2 < 0) ||
                   (puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1),
                   *puVar5 == '\0')) {
                  puVar7 = (uint *)MemMat<int>::operator()
                                             ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                  uVar4 = *puVar7;
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *puVar7 = uVar4;
                }
                else {
                  piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  iVar1 = *piVar6;
                  piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *piVar6 = iVar1;
                }
              }
              else {
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                iVar1 = *piVar6;
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *piVar6 = iVar1;
              }
            }
            else {
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
              uVar4 = *puVar7;
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
              uVar4 = RemSP::MemMerge(uVar4,*puVar7);
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *puVar7 = uVar4;
            }
          }
          else if (((c_1 + -1 < 0) || (r_1 + -1 < 0)) ||
                  (puVar5 = MemMat<unsigned_char>::operator()
                                      ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -1),
                  *puVar5 == '\0')) {
            if ((r_1 + -1 < 0) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1), *puVar5 == '\0'
               )) {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *piVar6 = iVar1;
            }
            else if ((c_1 + -2 < 0) ||
                    (puVar5 = MemMat<unsigned_char>::operator()
                                        ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + -2),
                    *puVar5 == '\0')) {
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
              uVar4 = *puVar7;
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
              uVar4 = RemSP::MemMerge(uVar4,*puVar7);
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *puVar7 = uVar4;
            }
            else if (((c_1 + -2 < 0) || (r_1 + -1 < 0)) ||
                    (puVar5 = MemMat<unsigned_char>::operator()
                                        ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -2),
                    *puVar5 == '\0')) {
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
              uVar4 = *puVar7;
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
              uVar4 = RemSP::MemMerge(uVar4,*puVar7);
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *puVar7 = uVar4;
            }
            else if (((c_1 + -1 < 0) || (r_1 + -2 < 0)) ||
                    (puVar5 = MemMat<unsigned_char>::operator()
                                        ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + -1),
                    *puVar5 == '\0')) {
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
              uVar4 = *puVar7;
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
              uVar4 = RemSP::MemMerge(uVar4,*puVar7);
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *puVar7 = uVar4;
            }
            else {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *piVar6 = iVar1;
            }
          }
          else if ((c_1 + -2 < 0) ||
                  (puVar5 = MemMat<unsigned_char>::operator()
                                      ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + -2),
                  *puVar5 == '\0')) {
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + -2);
            uVar4 = *puVar7;
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
            uVar4 = RemSP::MemMerge(uVar4,*puVar7);
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
            *puVar7 = uVar4;
          }
          else {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
            *piVar6 = iVar1;
          }
        }
        else if (((c_1 + -1 < 0) || (r_1 + -1 < 0)) ||
                (puVar5 = MemMat<unsigned_char>::operator()
                                    ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -1),
                *puVar5 == '\0')) {
          if ((r_1 + -1 < 0) ||
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1), *puVar5 == '\0'))
          {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
            *piVar6 = iVar1;
          }
          else if ((c_1 + -2 < 0) ||
                  (puVar5 = MemMat<unsigned_char>::operator()
                                      ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + -2),
                  *puVar5 == '\0')) {
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
            uVar4 = *puVar7;
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
            uVar4 = RemSP::MemMerge(uVar4,*puVar7);
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
            *puVar7 = uVar4;
          }
          else if (((c_1 + -2 < 0) || (r_1 + -1 < 0)) ||
                  (puVar5 = MemMat<unsigned_char>::operator()
                                      ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -2),
                  *puVar5 == '\0')) {
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
            uVar4 = *puVar7;
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
            uVar4 = RemSP::MemMerge(uVar4,*puVar7);
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
            *puVar7 = uVar4;
          }
          else if (((c_1 + -1 < 0) || (r_1 + -2 < 0)) ||
                  (puVar5 = MemMat<unsigned_char>::operator()
                                      ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + -1),
                  *puVar5 == '\0')) {
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
            uVar4 = *puVar7;
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
            uVar4 = RemSP::MemMerge(uVar4,*puVar7);
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
            *puVar7 = uVar4;
          }
          else {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
            *piVar6 = iVar1;
          }
        }
        else if ((c_1 + -2 < 0) ||
                (puVar5 = MemMat<unsigned_char>::operator()
                                    ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + -2),
                *puVar5 == '\0')) {
          puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + -2);
          uVar4 = *puVar7;
          puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
          uVar4 = RemSP::MemMerge(uVar4,*puVar7);
          puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
          *puVar7 = uVar4;
        }
        else {
          piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
          iVar1 = *piVar6;
          piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
          *piVar6 = iVar1;
        }
      }
      else if ((c_1 + 1 < (int)img.accesses_._88_4_) &&
              ((-1 < r_1 + -1 &&
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + 1),
               *puVar5 != '\0')))) {
        if ((r_1 + -1 < 0) ||
           (puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1), *puVar5 == '\0')) {
          if ((r_1 + -2 < 0) ||
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1), *puVar5 == '\0'))
          {
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
            uVar4 = *puVar7;
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
            uVar4 = RemSP::MemMerge(uVar4,*puVar7);
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
            *puVar7 = uVar4;
          }
          else if ((c_1 + -1 < 0) ||
                  ((r_1 + -1 < 0 ||
                   (puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -1),
                   *puVar5 == '\0')))) {
            if (((c_1 + -2 < 0) || (r_1 + -1 < 0)) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -2),
               *puVar5 == '\0')) {
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
              uVar4 = *puVar7;
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
              uVar4 = RemSP::MemMerge(uVar4,*puVar7);
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *puVar7 = uVar4;
            }
            else if (((c_1 + -1 < 0) || (r_1 + -2 < 0)) ||
                    (puVar5 = MemMat<unsigned_char>::operator()
                                        ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + -1),
                    *puVar5 == '\0')) {
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1);
              uVar4 = *puVar7;
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
              uVar4 = RemSP::MemMerge(uVar4,*puVar7);
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *puVar7 = uVar4;
            }
            else {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *piVar6 = iVar1;
            }
          }
          else {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
            *piVar6 = iVar1;
          }
        }
        else {
          piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
          iVar1 = *piVar6;
          piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
          *piVar6 = iVar1;
        }
      }
      else if ((c_1 + 1 < (int)img.accesses_._88_4_) &&
              (puVar5 = MemMat<unsigned_char>::operator()
                                  ((MemMat<unsigned_char> *)local_e8,r_1,c_1 + 1), *puVar5 != '\0'))
      {
        if ((c_1 + 2 < (int)img.accesses_._88_4_) &&
           ((-1 < r_1 + -1 &&
            (puVar5 = MemMat<unsigned_char>::operator()
                                ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + 2),
            *puVar5 != '\0')))) {
          if ((c_1 + 1 < (int)img.accesses_._88_4_) &&
             ((-1 < r_1 + -2 &&
              (puVar5 = MemMat<unsigned_char>::operator()
                                  ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + 1),
              *puVar5 != '\0')))) {
            if ((r_1 + -1 < 0) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1), *puVar5 == '\0'
               )) {
              if ((r_1 + -2 < 0) ||
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1),
                 *puVar5 == '\0')) {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *puVar7 = uVar4;
              }
              else if ((c_1 + -1 < 0) ||
                      ((r_1 + -1 < 0 ||
                       (puVar5 = MemMat<unsigned_char>::operator()
                                           ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -1),
                       *puVar5 == '\0')))) {
                if (((c_1 + -2 < 0) || (r_1 + -1 < 0)) ||
                   (puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e8,r_1 + -1,c_1 + -2),
                   *puVar5 == '\0')) {
                  puVar7 = (uint *)MemMat<int>::operator()
                                             ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                  uVar4 = *puVar7;
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *puVar7 = uVar4;
                }
                else if (((c_1 + -1 < 0) || (r_1 + -2 < 0)) ||
                        (puVar5 = MemMat<unsigned_char>::operator()
                                            ((MemMat<unsigned_char> *)local_e8,r_1 + -2,c_1 + -1),
                        *puVar5 == '\0')) {
                  puVar7 = (uint *)MemMat<int>::operator()
                                             ((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
                  uVar4 = *puVar7;
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  uVar4 = RemSP::MemMerge(uVar4,*puVar7);
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *puVar7 = uVar4;
                }
                else {
                  piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                  iVar1 = *piVar6;
                  piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                  *piVar6 = iVar1;
                }
              }
              else {
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
                iVar1 = *piVar6;
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
                *piVar6 = iVar1;
              }
            }
            else {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
              *piVar6 = iVar1;
            }
          }
          else {
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1 + -2,c_1 + 2);
            uVar4 = *puVar7;
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
            uVar4 = RemSP::MemMerge(uVar4,*puVar7);
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
            *puVar7 = uVar4;
          }
        }
        else {
          piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
          iVar1 = *piVar6;
          piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
          *piVar6 = iVar1;
        }
      }
      else {
        piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1 + -2);
        iVar1 = *piVar6;
        piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,r_1,c_1);
        *piVar6 = iVar1;
      }
    }
  }
  uVar4 = RemSP::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar4;
  for (iLabel = 0; iLabel < (int)img.accesses_._92_4_; iLabel = iLabel + 2) {
    for (local_238 = 0; local_238 < (int)img.accesses_._88_4_; local_238 = local_238 + 2) {
      puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,iLabel,local_238);
      local_23c = *puVar7;
      if ((int)local_23c < 1) {
        piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel,local_238);
        *piVar6 = 0;
        if (local_238 + 1 < (int)img.accesses_._88_4_) {
          piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel,local_238 + 1);
          *piVar6 = 0;
          if (iLabel + 1 < (int)img.accesses_._92_4_) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel + 1,local_238);
            *piVar6 = 0;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel + 1,local_238 + 1);
            *piVar6 = 0;
          }
        }
        else if (iLabel + 1 < (int)img.accesses_._92_4_) {
          piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel + 1,local_238);
          *piVar6 = 0;
        }
      }
      else {
        local_23c = RemSP::MemGetLabel(local_23c);
        puVar5 = MemMat<unsigned_char>::operator()
                           ((MemMat<unsigned_char> *)local_e8,iLabel,local_238);
        uVar4 = local_23c;
        if (*puVar5 == '\0') {
          piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel,local_238);
          *piVar6 = 0;
        }
        else {
          puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,iLabel,local_238);
          *puVar7 = uVar4;
        }
        if (local_238 + 1 < (int)img.accesses_._88_4_) {
          puVar5 = MemMat<unsigned_char>::operator()
                             ((MemMat<unsigned_char> *)local_e8,iLabel,local_238 + 1);
          uVar4 = local_23c;
          if (*puVar5 == '\0') {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel,local_238 + 1);
            *piVar6 = 0;
          }
          else {
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,iLabel,local_238 + 1);
            *puVar7 = uVar4;
          }
          if (iLabel + 1 < (int)img.accesses_._92_4_) {
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,iLabel + 1,local_238);
            uVar4 = local_23c;
            if (*puVar5 == '\0') {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel + 1,local_238);
              *piVar6 = 0;
            }
            else {
              puVar7 = (uint *)MemMat<int>::operator()
                                         ((MemMat<int> *)local_220,iLabel + 1,local_238);
              *puVar7 = uVar4;
            }
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e8,iLabel + 1,local_238 + 1);
            uVar4 = local_23c;
            if (*puVar5 == '\0') {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel + 1,local_238 + 1);
              *piVar6 = 0;
            }
            else {
              puVar7 = (uint *)MemMat<int>::operator()
                                         ((MemMat<int> *)local_220,iLabel + 1,local_238 + 1);
              *puVar7 = uVar4;
            }
          }
        }
        else if (iLabel + 1 < (int)img.accesses_._92_4_) {
          puVar5 = MemMat<unsigned_char>::operator()
                             ((MemMat<unsigned_char> *)local_e8,iLabel + 1,local_238);
          uVar4 = local_23c;
          if (*puVar5 == '\0') {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_220,iLabel + 1,local_238);
            *piVar6 = 0;
          }
          else {
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_220,iLabel + 1,local_238);
            *puVar7 = uVar4;
          }
        }
      }
    }
  }
  local_260 = 0;
  std::allocator<unsigned_long>::allocator(&local_261);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_258,4,&local_260,&local_261);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(accesses,&local_258);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_258);
  std::allocator<unsigned_long>::~allocator(&local_261);
  dVar9 = MemMat<unsigned_char>::GetTotalAccesses((MemMat<unsigned_char> *)local_e8);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](accesses,0);
  *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
  dVar9 = MemMat<int>::GetTotalAccesses((MemMat<int> *)local_220);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](accesses,1);
  *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
  dVar9 = RemSP::MemTotalAccesses();
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](accesses,2);
  *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
  MemMat<int>::GetImage(&local_2c8,(MemMat<int> *)local_220);
  cv::Mat_<int>::operator=
            ((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_2c8);
  cv::Mat_<int>::~Mat_(&local_2c8);
  RemSP::MemDealloc();
  MemMat<int>::~MemMat((MemMat<int> *)local_220);
  MemMat<unsigned_char>::~MemMat((MemMat<unsigned_char> *)local_e8);
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        //Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        // We work with 2x2 blocks
        // +-+-+-+
        // |P|Q|R|
        // +-+-+-+
        // |S|X|
        // +-+-+

        // The pixels are named as follows
        // +---+---+---+
        // |a b|c d|e f|
        // |g h|i j|k l|
        // +---+---+---+
        // |m n|o p|
        // |q r|s t|
        // +---+---+

        // Pixels a, f, l, q are not needed, since we need to understand the
        // the connectivity between these blocks and those pixels only metter
        // when considering the outer connectivities

        // A bunch of defines used to check if the pixels are foreground,
        // without going outside the image limits.

        for (int r = 0; r < h; r += 2) {
            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img(r-2, c-1)>0
#define CONDITION_C r-2>=0 && img(r-2, c)>0
#define CONDITION_D c+1<w && r-2>=0 && img(r-2, c+1)>0
#define CONDITION_E c+2<w && r-2>=0 && img(r-2, c+2)>0

#define CONDITION_G c-2>=0 && r-1>=0 && img(r-1, c-2)>0
#define CONDITION_H c-1>=0 && r-1>=0 && img(r-1, c-1)>0
#define CONDITION_I r-1>=0 && img(r-1, c)>0
#define CONDITION_J c+1<w && r-1>=0 && img(r-1, c+1)>0
#define CONDITION_K c+2<w && r-1>=0 && img(r-1, c+2)>0

#define CONDITION_M c-2>=0 && img(r, c-2)>0
#define CONDITION_N c-1>=0 && img(r, c-1)>0
#define CONDITION_O img(r,c)>0
#define CONDITION_P c+1<w && img(r,c+1)>0

#define CONDITION_R c-1>=0 && r+1<h && img(r+1, c-1)>0
#define CONDITION_S r+1<h && img(r+1, c)>0
#define CONDITION_T c+1<w && r+1<h && img(r+1, c+1)>0

                // Action 1: No action
#define ACTION_1 img_labels(r, c) = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels(r, c) = img_labels(r - 2, c - 2); continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels(r, c) = img_labels(r - 2, c); continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels(r, c) = img_labels(r - 2, c + 2); continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 2); continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r, c - 2)); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r, c - 2)); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c + 2), img_labels(r, c - 2)); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)), img_labels(r, c - 2)); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)), img_labels(r, c - 2)); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)), img_labels(r, c - 2)); continue;

#include "labeling_grana_2010_tree.inc.h"
            }
        }

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r = 0; r < h; r += 2) {
            for (int c = 0; c < w; c += 2) {
                int iLabel = img_labels(r, c);
                if (iLabel > 0) {
                    iLabel = LabelsSolver::MemGetLabel(iLabel);
                    if (img(r, c) > 0)
                        img_labels(r, c) = iLabel;
                    else
                        img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        if (img(r, c + 1) > 0)
                            img_labels(r, c + 1) = iLabel;
                        else
                            img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            if (img(r + 1, c) > 0)
                                img_labels(r + 1, c) = iLabel;
                            else
                                img_labels(r + 1, c) = 0;
                            if (img(r + 1, c + 1) > 0)
                                img_labels(r + 1, c + 1) = iLabel;
                            else
                                img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        if (img(r + 1, c) > 0)
                            img_labels(r + 1, c) = iLabel;
                        else
                            img_labels(r + 1, c) = 0;
                    }
                }
                else {
                    img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            img_labels(r + 1, c) = 0;
                            img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        img_labels(r + 1, c) = 0;
                    }
                }
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }